

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

void __thiscall pstack::CacheReader::CacheReader(CacheReader *this,csptr *upstream_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__CacheReader_0017c7d8;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->stringCache)._M_h._M_buckets = &(this->stringCache)._M_h._M_single_bucket;
  (this->stringCache)._M_h._M_bucket_count = 1;
  (this->stringCache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stringCache)._M_h._M_element_count = 0;
  (this->stringCache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stringCache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stringCache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pages).
  super__List_base<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>,_std::allocator<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->pages;
  (this->pages).
  super__List_base<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>,_std::allocator<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->pages;
  (this->pages).
  super__List_base<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>,_std::allocator<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

CacheReader::CacheReader(Reader::csptr upstream_)
    : upstream(std::move(upstream_))
{
}